

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_session_reset_int(mbedtls_ssl_context *ssl,int partial)

{
  mbedtls_ssl_session *session;
  int iVar1;
  
  ssl->state = 0;
  mbedtls_ssl_session_reset_msg_layer(ssl,partial);
  ssl->secure_renegotiation = 0;
  ssl->session_in = (mbedtls_ssl_session *)0x0;
  ssl->session_out = (mbedtls_ssl_session *)0x0;
  session = ssl->session;
  if (session != (mbedtls_ssl_session *)0x0) {
    ssl_clear_peer_cert(session);
    mbedtls_platform_zeroize(session,0x78);
    free(ssl->session);
    ssl->session = (mbedtls_ssl_session *)0x0;
  }
  free(ssl->cli_id);
  ssl->cli_id = (uchar *)0x0;
  ssl->cli_id_len = 0;
  iVar1 = ssl_handshake_init(ssl);
  return iVar1;
}

Assistant:

int mbedtls_ssl_session_reset_int(mbedtls_ssl_context *ssl, int partial)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    ssl->state = MBEDTLS_SSL_HELLO_REQUEST;

    mbedtls_ssl_session_reset_msg_layer(ssl, partial);

    /* Reset renegotiation state */
#if defined(MBEDTLS_SSL_RENEGOTIATION)
    ssl->renego_status = MBEDTLS_SSL_INITIAL_HANDSHAKE;
    ssl->renego_records_seen = 0;

    ssl->verify_data_len = 0;
    memset(ssl->own_verify_data, 0, MBEDTLS_SSL_VERIFY_DATA_MAX_LEN);
    memset(ssl->peer_verify_data, 0, MBEDTLS_SSL_VERIFY_DATA_MAX_LEN);
#endif
    ssl->secure_renegotiation = MBEDTLS_SSL_LEGACY_RENEGOTIATION;

    ssl->session_in  = NULL;
    ssl->session_out = NULL;
    if (ssl->session) {
        mbedtls_ssl_session_free(ssl->session);
        mbedtls_free(ssl->session);
        ssl->session = NULL;
    }

#if defined(MBEDTLS_SSL_ALPN)
    ssl->alpn_chosen = NULL;
#endif

#if defined(MBEDTLS_SSL_DTLS_HELLO_VERIFY) && defined(MBEDTLS_SSL_SRV_C)
    int free_cli_id = 1;
#if defined(MBEDTLS_SSL_DTLS_CLIENT_PORT_REUSE)
    free_cli_id = (partial == 0);
#endif
    if (free_cli_id) {
        mbedtls_free(ssl->cli_id);
        ssl->cli_id = NULL;
        ssl->cli_id_len = 0;
    }
#endif

    if ((ret = ssl_handshake_init(ssl)) != 0) {
        return ret;
    }

    return 0;
}